

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm_sse2.h
# Opt level: O3

void fidentity8x16_new_sse2(__m128i *input,__m128i *output,int8_t cos_bit)

{
  undefined1 auVar1 [16];
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar7 [16];
  undefined1 auVar6 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  auVar1 = _DAT_005690d0;
  lVar2 = 0;
  do {
    auVar10 = *(undefined1 (*) [16])((long)*input + lVar2);
    auVar9._0_12_ = auVar10._0_12_;
    auVar9._12_2_ = auVar10._6_2_;
    auVar9._14_2_ = 1;
    auVar8._12_4_ = auVar9._12_4_;
    auVar8._0_10_ = auVar10._0_10_;
    auVar8._10_2_ = 1;
    auVar7._10_6_ = auVar8._10_6_;
    auVar7._0_8_ = auVar10._0_8_;
    auVar7._8_2_ = auVar10._4_2_;
    auVar6._8_8_ = auVar7._8_8_;
    auVar6._0_8_ = 0x1000000000000;
    auVar5._6_10_ = auVar6._6_10_;
    auVar5._4_2_ = auVar10._2_2_;
    auVar5._0_2_ = auVar10._0_2_;
    auVar5._2_2_ = 1;
    auVar3._2_2_ = 0;
    auVar3._0_2_ = auVar10._8_2_;
    auVar3._4_2_ = auVar10._10_2_;
    auVar3._6_2_ = 0;
    auVar3._8_2_ = auVar10._12_2_;
    auVar3._10_2_ = 0;
    auVar3._12_2_ = auVar10._14_2_;
    auVar3._14_2_ = 1;
    auVar10 = pmaddwd(auVar5,auVar1);
    auVar11._0_4_ = auVar10._0_4_ >> 0xc;
    auVar11._4_4_ = auVar10._4_4_ >> 0xc;
    auVar11._8_4_ = auVar10._8_4_ >> 0xc;
    auVar11._12_4_ = auVar10._12_4_ >> 0xc;
    auVar10 = pmaddwd(auVar3,auVar1);
    auVar4._0_4_ = auVar10._0_4_ >> 0xc;
    auVar4._4_4_ = auVar10._4_4_ >> 0xc;
    auVar4._8_4_ = auVar10._8_4_ >> 0xc;
    auVar4._12_4_ = auVar10._12_4_ >> 0xc;
    auVar10 = packssdw(auVar11,auVar4);
    *(undefined1 (*) [16])((long)*output + lVar2) = auVar10;
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x100);
  return;
}

Assistant:

static inline void fidentity8x16_new_sse2(const __m128i *input, __m128i *output,
                                          int8_t cos_bit) {
  (void)cos_bit;
  const __m128i one = _mm_set1_epi16(1);

  for (int i = 0; i < 16; ++i) {
    const __m128i a_lo = _mm_unpacklo_epi16(input[i], one);
    const __m128i a_hi = _mm_unpackhi_epi16(input[i], one);
    const __m128i b_lo = scale_round_sse2(a_lo, 2 * NewSqrt2);
    const __m128i b_hi = scale_round_sse2(a_hi, 2 * NewSqrt2);
    output[i] = _mm_packs_epi32(b_lo, b_hi);
  }
}